

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locality.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  long lVar5;
  int iVar6;
  topology topo;
  allocator<int> a;
  object obj;
  vector<int,_hwlocxx::allocator<int>_> v1;
  undefined1 local_c0 [20];
  int local_ac;
  allocator_type local_a8;
  object local_88;
  hwloc_obj *local_78;
  topology *ptStack_70;
  _Vector_base<int,_hwlocxx::allocator<int>_> local_68;
  
  hwlocxx::topology::topology((topology *)local_c0);
  local_ac = hwloc_topology_get_depth(local_c0._0_8_);
  if (0 < local_ac) {
    iVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"*** Objects at level ",0x15);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      iVar1 = hwloc_get_nbobjs_by_depth(local_c0._0_8_,iVar6);
      if (0 < iVar1) {
        iVar1 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Index ",6);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
          local_68._M_impl.super__Tp_alloc_type.topo_.topology_.
          super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)hwloc_get_obj_by_depth(local_c0._0_8_,iVar6,iVar1);
          if ((hwloc_obj *)
              local_68._M_impl.super__Tp_alloc_type.topo_.topology_.
              super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (hwloc_obj *)0x0) {
            std::terminate();
          }
          local_68._M_impl.super__Tp_alloc_type.topo_.topology_.
          super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0;
          poVar4 = hwlocxx::operator<<(poVar4,(object *)&local_68);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          iVar1 = iVar1 + 1;
          iVar2 = hwloc_get_nbobjs_by_depth(local_c0._0_8_,iVar6);
        } while (iVar1 < iVar2);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != local_ac);
  }
  iVar6 = hwlocxx::topology::get_width_by_type((topology *)local_c0,HWLOC_OBJ_NUMANODE);
  hwlocxx::topology::object::object(&local_88,(topology *)local_c0,HWLOC_OBJ_NUMANODE,iVar6 + -1);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_c0._8_8_ + 8) = *(_Atomic_word *)(local_c0._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_c0._8_8_ + 8) = *(_Atomic_word *)(local_c0._8_8_ + 8) + 1;
    }
  }
  local_78 = local_88.obj_.ptr_;
  ptStack_70 = local_88.topo_.ptr_;
  local_a8.topo_.topology_.super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c0._0_8_;
  local_a8.topo_.topology_.super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_a8.obj_.obj_.ptr_ = local_88.obj_.ptr_;
    local_a8.obj_.topo_.ptr_ = local_88.topo_.ptr_;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_c0._8_8_ + 8) = *(_Atomic_word *)(local_c0._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_c0._8_8_ + 8) = *(_Atomic_word *)(local_c0._8_8_ + 8) + 1;
    }
    local_a8.obj_.obj_.ptr_ = local_88.obj_.ptr_;
    local_a8.obj_.topo_.ptr_ = local_88.topo_.ptr_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
    }
  }
  if (local_a8.topo_.topology_.super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a8.topo_.topology_.super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a8.topo_.topology_.super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a8.topo_.topology_.super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a8.topo_.topology_.super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
    if (local_a8.topo_.topology_.super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.topo_.topology_.
                 super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  std::_Vector_base<int,_hwlocxx::allocator<int>_>::_Vector_base(&local_68,10,&local_a8);
  local_68._M_impl.super__Vector_impl_data._M_start[4] = 0;
  local_68._M_impl.super__Vector_impl_data._M_start[5] = 0;
  local_68._M_impl.super__Vector_impl_data._M_start[6] = 0;
  local_68._M_impl.super__Vector_impl_data._M_start[7] = 0;
  local_68._M_impl.super__Vector_impl_data._M_start[0] = 0;
  local_68._M_impl.super__Vector_impl_data._M_start[1] = 0;
  local_68._M_impl.super__Vector_impl_data._M_start[2] = 0;
  local_68._M_impl.super__Vector_impl_data._M_start[3] = 0;
  local_68._M_impl.super__Vector_impl_data._M_start[8] = 0;
  local_68._M_impl.super__Vector_impl_data._M_start[9] = 0;
  local_68._M_impl.super__Vector_impl_data._M_finish =
       local_68._M_impl.super__Vector_impl_data._M_start + 10;
  iVar6 = 1;
  lVar5 = 0;
  do {
    *(int *)((long)local_68._M_impl.super__Vector_impl_data._M_start + lVar5) = iVar6;
    iVar6 = iVar6 + 1;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x28);
  lVar5 = 0;
  iVar6 = 0;
  do {
    iVar6 = iVar6 + *(int *)((long)local_68._M_impl.super__Vector_impl_data._M_start + lVar5);
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x28);
  std::_Vector_base<int,_hwlocxx::allocator<int>_>::~_Vector_base(&local_68);
  if (local_a8.topo_.topology_.super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.topo_.topology_.
               super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
  }
  return 0x37 - iVar6;
}

Assistant:

int main()
{
   int depth;
   int i, n;
   int topodepth;

   hwlocxx::topology topo;

   /* Optionally, get some additional topology information
      in case we need the topology depth later. */
   topodepth = topo.get_depth();

   /*
    * Example:
    *   Print the topology
    */
   for (depth = 0; depth < topodepth; depth++)
   {
      std::cout << "*** Objects at level " << depth << std::endl;
      for (i = 0; i < topo.get_width_at_depth(depth); i++)
      {
         std::cout << "Index " << i << ":" << topo.get_obj(depth, i)
                   << std::endl;
      }
   }

   /* Example:
    *    Use the hwlocxx allocator to allocate storage for a vector
    */
   n = topo.get_width_by_type(HWLOC_OBJ_NUMANODE);
   auto obj = topo.get_object_by_type(HWLOC_OBJ_NUMANODE, n - 1);
   hwlocxx::allocator<int> a{topo, obj};

   size_t nElems = 10u;
   std::vector<int, hwlocxx::allocator<int>> v1{nElems, a};
   std::iota(std::begin(v1), std::end(v1), 1);
   auto sum = std::accumulate(std::begin(v1), std::end(v1), 0, std::plus<>());
   auto sumResult = (nElems * (nElems + 1) / 2);
   return static_cast<int>(sumResult - sum);
}